

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O3

int compare_tile_order(void *a,void *b)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if ((*a <= *b) && (uVar1 = 1, *a == *b)) {
    uVar1 = (*(ushort *)((long)b + 8) < *(ushort *)((long)a + 8)) - 1 | 1;
  }
  return uVar1;
}

Assistant:

static int compare_tile_order(const void *a, const void *b) {
  const PackBSTileOrder *const tile_a = (const PackBSTileOrder *)a;
  const PackBSTileOrder *const tile_b = (const PackBSTileOrder *)b;

  if (tile_a->abs_sum_level > tile_b->abs_sum_level)
    return -1;
  else if (tile_a->abs_sum_level == tile_b->abs_sum_level)
    return (tile_a->tile_idx > tile_b->tile_idx ? 1 : -1);
  else
    return 1;
}